

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void wallet::coinselector_tests::effective_value_test_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_wrap_stringstream<char> *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  pointer local_ba0;
  pointer local_b98;
  char *local_b90;
  char *local_b88;
  pointer local_b80;
  pointer local_b78;
  char *local_b70;
  char *local_b68;
  pointer local_b60;
  pointer local_b58;
  char *local_b50;
  char *local_b48;
  pointer local_b40;
  pointer local_b38;
  char *local_b30;
  char *local_b28;
  pointer local_b20;
  pointer local_b18;
  char *local_b10;
  char *local_b08;
  basic_wrap_stringstream<char> local_b00;
  effective_value_test t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b08 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"effective_value_test");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_b20 = (pbVar3->_M_dataplus)._M_p;
  local_b18 = local_b20 + pbVar3->_M_string_length;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x426;
  file.m_begin = (iterator)&local_b10;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_b20,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  effective_value_test::effective_value_test(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b28 = "";
  memset(&local_b00,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_b00);
  std::operator<<((ostream *)&local_b00,'\"');
  std::operator<<((ostream *)&local_b00,"effective_value_test");
  std::operator<<((ostream *)&local_b00,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_b00);
  local_b40 = (pbVar3->_M_dataplus)._M_p;
  local_b38 = local_b40 + pbVar3->_M_string_length;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x426;
  file_00.m_begin = (iterator)&local_b30;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_b40,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_b00);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b48 = "";
  memset(&local_b00,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_b00);
  std::operator<<((ostream *)&local_b00,'\"');
  std::operator<<((ostream *)&local_b00,"effective_value_test");
  std::operator<<((ostream *)&local_b00,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_b00);
  local_b60 = (pbVar3->_M_dataplus)._M_p;
  local_b58 = local_b60 + pbVar3->_M_string_length;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0x426;
  file_01.m_begin = (iterator)&local_b50;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_b60,msg_01);
  this = &local_b00;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  effective_value_test::test_method((effective_value_test *)this);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b68 = "";
  memset(&local_b00,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_b00);
  std::operator<<((ostream *)&local_b00,'\"');
  std::operator<<((ostream *)&local_b00,"effective_value_test");
  std::operator<<((ostream *)&local_b00,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_b00);
  local_b80 = (pbVar3->_M_dataplus)._M_p;
  local_b78 = local_b80 + pbVar3->_M_string_length;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = (iterator)0x426;
  file_02.m_begin = (iterator)&local_b70;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_b80,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_b00);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b88 = "";
  memset(&local_b00,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_b00);
  std::operator<<((ostream *)&local_b00,'\"');
  std::operator<<((ostream *)&local_b00,"effective_value_test");
  std::operator<<((ostream *)&local_b00,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_b00);
  local_ba0 = (pbVar3->_M_dataplus)._M_p;
  local_b98 = local_ba0 + pbVar3->_M_string_length;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  file_03.m_end = (iterator)0x426;
  file_03.m_begin = (iterator)&local_b90;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_ba0,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_b00);
  WalletTestingSetup::~WalletTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(effective_value_test)
{
    const int input_bytes = 148;
    const CFeeRate feerate(1000);
    const CAmount nValue = 10000;
    const int nInput = 0;

    CMutableTransaction tx;
    tx.vout.resize(1);
    tx.vout[nInput].nValue = nValue;

    // standard case, pass feerate in constructor
    COutput output1(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, feerate);
    const CAmount expected_ev1 = 9852; // 10000 - 148
    BOOST_CHECK_EQUAL(output1.GetEffectiveValue(), expected_ev1);

    // input bytes unknown (input_bytes = -1), pass feerate in constructor
    COutput output2(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, /*input_bytes=*/ -1, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, feerate);
    BOOST_CHECK_EQUAL(output2.GetEffectiveValue(), nValue); // The effective value should be equal to the absolute value if input_bytes is -1

    // negative effective value, pass feerate in constructor
    COutput output3(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, CFeeRate(100000));
    const CAmount expected_ev3 = -4800; // 10000 - 14800
    BOOST_CHECK_EQUAL(output3.GetEffectiveValue(), expected_ev3);

    // standard case, pass fees in constructor
    const CAmount fees = 148;
    COutput output4(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, fees);
    BOOST_CHECK_EQUAL(output4.GetEffectiveValue(), expected_ev1);

    // input bytes unknown (input_bytes = -1), pass fees in constructor
    COutput output5(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, /*input_bytes=*/ -1, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, /*fees=*/ 0);
    BOOST_CHECK_EQUAL(output5.GetEffectiveValue(), nValue); // The effective value should be equal to the absolute value if input_bytes is -1
}